

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_arena.pb.cc
# Opt level: O3

void __thiscall proto3_arena_unittest::NestedTestAllTypes::Clear(NestedTestAllTypes *this)

{
  NestedTestAllTypes *this_00;
  TestAllTypes *pTVar1;
  anon_union_56_1_493b367e_for_NestedTestAllTypes_3 aVar2;
  Nonnull<const_char_*> failure_msg;
  int line;
  LogMessageFatal local_20;
  
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto3_arena_unittest::NestedTestAllTypes>>
            (&(this->field_0)._impl_.repeated_child_.super_RepeatedPtrFieldBase);
  aVar2 = this->field_0;
  if (((undefined1  [56])aVar2 & (undefined1  [56])0x7) != (undefined1  [56])0x0) {
    if (((undefined1  [56])aVar2 & (undefined1  [56])0x1) != (undefined1  [56])0x0) {
      this_00 = (this->field_0)._impl_.child_;
      if (this_00 == (NestedTestAllTypes *)0x0) {
        failure_msg = "_impl_.child_ != nullptr";
        line = 0x128f;
        goto LAB_00d00322;
      }
      Clear(this_00);
    }
    if (((undefined1  [56])aVar2 & (undefined1  [56])0x2) != (undefined1  [56])0x0) {
      pTVar1 = (this->field_0)._impl_.payload_;
      if (pTVar1 == (TestAllTypes *)0x0) {
        failure_msg = "_impl_.payload_ != nullptr";
        line = 0x1293;
        goto LAB_00d00322;
      }
      TestAllTypes::Clear(pTVar1);
    }
    if (((undefined1  [56])aVar2 & (undefined1  [56])0x4) != (undefined1  [56])0x0) {
      pTVar1 = (this->field_0)._impl_.lazy_payload_;
      if (pTVar1 == (TestAllTypes *)0x0) {
        failure_msg = "_impl_.lazy_payload_ != nullptr";
        line = 0x1297;
LAB_00d00322:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_20,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_proto3_arena.pb.cc"
                   ,line,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
      }
      TestAllTypes::Clear(pTVar1);
    }
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void NestedTestAllTypes::Clear() {
// @@protoc_insertion_point(message_clear_start:proto3_arena_unittest.NestedTestAllTypes)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.repeated_child_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(_impl_.child_ != nullptr);
      _impl_.child_->Clear();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(_impl_.payload_ != nullptr);
      _impl_.payload_->Clear();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(_impl_.lazy_payload_ != nullptr);
      _impl_.lazy_payload_->Clear();
    }
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}